

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_conv_1d_dw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int p0,int d0)

{
  ggml_tensor *pgVar1;
  ggml_tensor *b_00;
  
  pgVar1 = ggml_reshape_4d(ctx,a,a->ne[0],1,a->ne[1],a->ne[2]);
  b_00 = ggml_reshape_4d(ctx,b,b->ne[0],1,b->ne[1],b->ne[2]);
  pgVar1 = ggml_im2col(ctx,pgVar1,b_00,s0,0,p0,0,d0,0,false,GGML_TYPE_F16);
  pgVar1 = ggml_mul_mat(ctx,pgVar1,a);
  pgVar1 = ggml_reshape_3d(ctx,pgVar1,b->ne[0],b->ne[1],1);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_conv_1d_dw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   p0,
        int                   d0) {
    struct ggml_tensor * new_a = ggml_reshape_4d(ctx, a, a->ne[0], 1, a->ne[1], a->ne[2]);
    struct ggml_tensor * new_b = ggml_reshape_4d(ctx, b, b->ne[0], 1, b->ne[1], b->ne[2]);

    struct ggml_tensor * im2col = ggml_im2col(ctx, new_a, new_b, s0, 0, p0, 0, d0, 0, false, GGML_TYPE_F16);

    struct ggml_tensor * result = ggml_mul_mat(ctx, im2col, a);

    result = ggml_reshape_3d(ctx, result, b->ne[0], b->ne[1], 1);

    return result;
}